

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_dform3D(DisasContext_conflict10 *ctx)

{
  _Bool _Var1;
  uint uVar2;
  TCGContext_conflict10 *pTVar3;
  int iVar4;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  TCGTemp *pTVar7;
  uintptr_t o;
  TCGv_i64 pTVar8;
  uint32_t excp;
  TCGv_i64 val;
  TCGContext_conflict10 *s;
  MemOp_conflict memop;
  uintptr_t o_1;
  TCGv_i64 pTVar9;
  TCGContext_conflict10 *tcg_ctx;
  uint uVar10;
  int iVar11;
  uintptr_t o_3;
  TCGv_i64 pTVar12;
  
  uVar2 = ctx->opcode;
  switch(uVar2 & 3) {
  case 0:
    if ((ctx->insns_flags2 & 0x20) == 0) {
LAB_00b93840:
      gen_exception_err(ctx,0x60,0x21);
      return;
    }
    if (ctx->fpu_enabled == false) {
      excp = 7;
      goto LAB_00b93c17;
    }
    s = ctx->uc->tcg_ctx;
    if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
      tcg_gen_op2_ppc64(s,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)s),0x30);
      ctx->access_type = 0x30;
    }
    pTVar6 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar12 = (TCGv_i64)((long)pTVar6 - (long)s);
    pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    gen_addr_imm_index(ctx,pTVar12,0);
    _Var1 = ctx->le_mode;
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((uint)_Var1 * 0x10 + 0x12b28 + (ctx->opcode >> 0x11 & 0x1f0)));
    tcg_gen_qemu_st_i64_ppc64
              (ctx->uc->tcg_ctx,(TCGv_i64)((long)pTVar5 - (long)s),pTVar12,(long)ctx->mem_idx,
               ctx->default_tcg_memop_mask | MO_64);
    tcg_gen_addi_i64_ppc64(s,pTVar12,pTVar12,8);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0x11 & 0x1f0) + 0x12b28 + (uint)(_Var1 ^ 1) * 0x10));
    tcg_gen_qemu_st_i64_ppc64
              (ctx->uc->tcg_ctx,(TCGv_i64)((long)pTVar5 - (long)s),pTVar12,(long)ctx->mem_idx,
               ctx->default_tcg_memop_mask | MO_64);
    tcg_temp_free_internal_ppc64(s,pTVar6);
    goto LAB_00b93bf2;
  case 1:
    if ((uVar2 & 5) == 5) {
      if ((ctx->insns_flags2 & 0x80000) == 0) goto LAB_00b93840;
      s = ctx->uc->tcg_ctx;
      uVar10 = uVar2 * 4 & 0x20;
      if (uVar10 == 0) {
        if (ctx->vsx_enabled == false) goto LAB_00b93887;
      }
      else if (ctx->altivec_enabled == false) break;
      pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      pTVar6 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      iVar11 = (uVar10 | uVar2 >> 0x15 & 0x1f) * 0x10;
      tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)(iVar11 + 0x12b28));
      tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar6,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)(iVar11 + 0x12b20));
      if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
        pTVar3 = ctx->uc->tcg_ctx;
        tcg_gen_op2_ppc64(pTVar3,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar3),0x20);
        ctx->access_type = 0x20;
      }
      pTVar9 = (TCGv_i64)((long)pTVar5 - (long)s);
      pTVar12 = (TCGv_i64)((long)pTVar6 - (long)s);
      pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      pTVar8 = (TCGv_i64)((long)pTVar5 - (long)s);
      gen_addr_imm_index(ctx,pTVar8,0xf);
      if (ctx->le_mode == true) {
        tcg_gen_qemu_st_i64_ppc64(s,pTVar12,pTVar8,(long)ctx->mem_idx,MO_64);
        tcg_gen_addi_i64_ppc64(s,pTVar8,pTVar8,8);
        iVar11 = ctx->mem_idx;
        memop = MO_64;
        val = pTVar9;
      }
      else {
        tcg_gen_qemu_st_i64_ppc64(s,pTVar9,pTVar8,(long)ctx->mem_idx,MO_BEQ);
        tcg_gen_addi_i64_ppc64(s,pTVar8,pTVar8,8);
        iVar11 = ctx->mem_idx;
        memop = MO_BEQ;
        val = pTVar12;
      }
      tcg_gen_qemu_st_i64_ppc64(s,val,pTVar8,(long)iVar11,memop);
      tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar8 + (long)s));
      pTVar5 = (TCGTemp *)(pTVar9 + (long)s);
    }
    else {
      if (((uVar2 & 5) != 1) || ((ctx->insns_flags2 & 0x80000) == 0)) goto LAB_00b93840;
      s = ctx->uc->tcg_ctx;
      uVar10 = uVar2 * 4 & 0x20;
      if (uVar10 == 0) {
        if (ctx->vsx_enabled == false) {
LAB_00b93887:
          excp = 0x5e;
          goto LAB_00b93c17;
        }
      }
      else if (ctx->altivec_enabled == false) break;
      pTVar6 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
        pTVar3 = ctx->uc->tcg_ctx;
        tcg_gen_op2_ppc64(pTVar3,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar3),0x20);
        ctx->access_type = 0x20;
      }
      pTVar9 = (TCGv_i64)((long)pTVar6 - (long)s);
      pTVar12 = (TCGv_i64)((long)pTVar5 - (long)s);
      pTVar7 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      pTVar8 = (TCGv_i64)((long)pTVar7 - (long)s);
      gen_addr_imm_index(ctx,pTVar8,0xf);
      iVar11 = (uVar10 | uVar2 >> 0x15 & 0x1f) * 0x10;
      if (ctx->le_mode == true) {
        tcg_gen_qemu_ld_i64_ppc64(s,pTVar12,pTVar8,(long)ctx->mem_idx,MO_64);
        tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                          (ulong)(iVar11 + 0x12b20));
        tcg_gen_addi_i64_ppc64(s,pTVar8,pTVar8,8);
        tcg_gen_qemu_ld_i64_ppc64(s,pTVar9,pTVar8,(long)ctx->mem_idx,MO_64);
        iVar4 = 0x12b28;
        pTVar5 = pTVar6;
      }
      else {
        tcg_gen_qemu_ld_i64_ppc64(s,pTVar9,pTVar8,(long)ctx->mem_idx,MO_BEQ);
        tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar6,(TCGArg)(s->cpu_env + (long)s),
                          (ulong)(iVar11 + 0x12b28));
        tcg_gen_addi_i64_ppc64(s,pTVar8,pTVar8,8);
        tcg_gen_qemu_ld_i64_ppc64(s,pTVar12,pTVar8,(long)ctx->mem_idx,MO_BEQ);
        iVar4 = 0x12b20;
      }
      tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)(uint)(iVar11 + iVar4));
      tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar8 + (long)s));
      pTVar5 = (TCGTemp *)(pTVar9 + (long)s);
    }
    tcg_temp_free_internal_ppc64(s,pTVar5);
    pTVar5 = (TCGTemp *)(pTVar12 + (long)s);
    goto LAB_00b93bf2;
  case 2:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto LAB_00b93840;
    if (ctx->altivec_enabled != false) {
      s = ctx->uc->tcg_ctx;
      pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      pTVar12 = (TCGv_i64)((long)pTVar5 - (long)s);
      tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12d28);
      if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
        pTVar3 = ctx->uc->tcg_ctx;
        tcg_gen_op2_ppc64(pTVar3,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar3),0x20);
        ctx->access_type = 0x20;
      }
      pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      gen_addr_imm_index(ctx,(TCGv_i64)((long)pTVar5 - (long)s),3);
      tcg_gen_qemu_st_i64_ppc64
                (ctx->uc->tcg_ctx,pTVar12,(TCGv_i64)((long)pTVar5 - (long)s),(long)ctx->mem_idx,
                 ctx->default_tcg_memop_mask | MO_64);
LAB_00b937eb:
      tcg_temp_free_internal_ppc64(s,pTVar5);
      pTVar5 = (TCGTemp *)(pTVar12 + (long)s);
LAB_00b93bf2:
      tcg_temp_free_internal_ppc64(s,pTVar5);
      return;
    }
    break;
  case 3:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto LAB_00b93840;
    if (ctx->altivec_enabled != false) {
      s = ctx->uc->tcg_ctx;
      pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      pTVar12 = (TCGv_i64)((long)pTVar5 - (long)s);
      tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12d28);
      if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
        pTVar3 = ctx->uc->tcg_ctx;
        tcg_gen_op2_ppc64(pTVar3,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar3),0x20);
        ctx->access_type = 0x20;
      }
      pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      gen_addr_imm_index(ctx,(TCGv_i64)((long)pTVar5 - (long)s),3);
      gen_qemu_st32fs(ctx,pTVar12,(TCGv_i64)((long)pTVar5 - (long)s));
      goto LAB_00b937eb;
    }
  }
  excp = 0x49;
LAB_00b93c17:
  gen_exception(ctx,excp);
  return;
}

Assistant:

static void gen_dform3D(DisasContext *ctx)
{
    if ((ctx->opcode & 3) == 1) { /* DQ-FORM */
        switch (ctx->opcode & 0x7) {
        case 1: /* lxv */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_lxv(ctx);
            }
            break;
        case 5: /* stxv */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxv(ctx);
            }
            break;
        }
    } else { /* DS-FORM */
        switch (ctx->opcode & 0x3) {
        case 0: /* stfdp */
            if (ctx->insns_flags2 & PPC2_ISA205) {
                return gen_stfdp(ctx);
            }
            break;
        case 2: /* stxsd */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxsd(ctx);
            }
            break;
        case 3: /* stxssp */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxssp(ctx);
            }
            break;
        }
    }
    return gen_invalid(ctx);
}